

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

OneofOptions * __thiscall
google::protobuf::OneofDescriptorProto::mutable_options(OneofDescriptorProto *this)

{
  OneofOptions *this_00;
  OneofDescriptorProto *this_local;
  
  set_has_options(this);
  if (this->options_ == (OneofOptions *)0x0) {
    this_00 = (OneofOptions *)operator_new(0x68);
    OneofOptions::OneofOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::OneofOptions* OneofDescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) {
    options_ = new ::google::protobuf::OneofOptions;
  }
  // @@protoc_insertion_point(field_mutable:google.protobuf.OneofDescriptorProto.options)
  return options_;
}